

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void gai_matmul_irreg(char *transa,char *transb,void *alpha,void *beta,Integer atype,Integer g_a,
                     Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,
                     Integer bihi,Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,
                     Integer cjlo,Integer cjhi,Integer Ichunk,Integer Kchunk,Integer Jchunk,
                     DoubleComplex **a_ar,DoubleComplex **b_ar,DoubleComplex **c_ar,
                     short need_scaling,short irregular)

{
  bool bVar1;
  int iVar2;
  Integer IVar3;
  Integer grp;
  long lVar4;
  long lVar5;
  long lVar6;
  Integer jdim_00;
  DoubleComplex *pDVar7;
  DoubleComplex *pDVar8;
  DoubleComplex *pDVar9;
  void *in_RDX;
  char *in_RSI;
  char *in_RDI;
  long in_R8;
  Integer in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000040;
  long in_stack_00000048;
  Integer chi [2];
  Integer clo [2];
  Integer a_grp;
  Integer grp_me;
  SingleComplex ONE_CF;
  DoubleComplex *c;
  DoubleComplex *b;
  DoubleComplex *a;
  DoubleComplex ONE;
  short shiftB;
  short shiftA;
  short compute_flag;
  task_list_t taskListC;
  Integer cdim_prev;
  Integer bdim_prev;
  Integer adim_prev;
  Integer kdim_prev;
  Integer jdim_prev;
  Integer idim_prev;
  Integer cdim;
  Integer bdim;
  Integer adim;
  Integer k;
  Integer m;
  Integer n;
  Integer ijk;
  Integer kdim;
  Integer khi;
  Integer klo;
  Integer jdim;
  Integer jhi;
  Integer jlo;
  Integer idim;
  Integer ihi;
  Integer ilo;
  Integer j1;
  Integer j0;
  Integer i1;
  Integer i0;
  Integer i;
  Integer get_new_B;
  Integer nproc;
  void *alpha_00;
  Integer *pIVar10;
  DoubleComplex *in_stack_fffffffffffffdd8;
  Integer *in_stack_fffffffffffffde0;
  Integer *hi;
  DoubleComplex *in_stack_fffffffffffffde8;
  Integer *in_stack_fffffffffffffdf0;
  Integer *transb_00;
  DoubleComplex *in_stack_fffffffffffffdf8;
  Integer in_stack_fffffffffffffe00;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  undefined4 uVar11;
  undefined4 uVar12;
  ushort local_166;
  ushort local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int in_stack_fffffffffffffeb0 [2];
  int in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  DoubleComplex *adim_00;
  DoubleComplex *b_00;
  DoubleComplex *pDVar13;
  DoubleComplex *c_00;
  DoubleComplex *cdim_00;
  DoubleComplex *local_118;
  DoubleComplex *local_108;
  DoubleComplex *local_100;
  long local_e0;
  long local_c8;
  long local_b0;
  long local_98;
  long local_70;
  
  IVar3 = pnga_nnodes();
  local_e0 = 0;
  local_108 = (DoubleComplex *)0x0;
  local_118 = (DoubleComplex *)0x0;
  cdim_00 = (DoubleComplex *)0x0;
  c_00 = (DoubleComplex *)0x0;
  local_100 = (DoubleComplex *)0x0;
  b_00 = (DoubleComplex *)0x0;
  adim_00 = (DoubleComplex *)0x0;
  local_164 = 0;
  local_166 = 0;
  grp = pnga_get_pgroup(in_R9);
  init_task_list((task_list_t *)&local_160);
  uVar11 = 0x3f800000;
  uVar12 = 0;
  lVar4 = in_stack_00000010 - in_stack_00000008;
  lVar5 = in_stack_00000048 - in_stack_00000040;
  lVar6 = in_stack_00000020 - in_stack_00000018;
  hi = *(Integer **)grp_me;
  transb_00 = *(Integer **)ONE_CF;
  jdim_00 = pnga_pgroup_nodeid(grp);
  if ((short)c == 0) {
    pnga_fill_patch(bihi,(Integer *)bilo,(Integer *)g_b,(void *)ajhi);
  }
  bVar1 = false;
  for (local_b0 = 0; local_b0 < lVar5 + 1; local_b0 = clo[1] + local_b0) {
    local_1e8 = lVar5;
    if (local_b0 + clo[1] + -1 < lVar5) {
      local_1e8 = local_b0 + clo[1] + -1;
    }
    pDVar7 = (DoubleComplex *)((local_1e8 - local_b0) + 1);
    for (local_c8 = 0; local_c8 < lVar6 + 1; local_c8 = clo[0] + local_c8) {
      local_1f0 = lVar6;
      if (local_c8 + clo[0] + -1 < lVar6) {
        local_1f0 = local_c8 + clo[0] + -1;
      }
      pDVar8 = (DoubleComplex *)((local_1f0 - local_c8) + 1);
      iVar2 = 1;
      for (local_98 = 0; local_98 < lVar4 + 1; local_98 = chi[1] + local_98) {
        pDVar9 = adim_00;
        if (local_e0 % IVar3 == jdim_00) {
          local_1f8 = lVar4;
          if (local_98 + chi[1] + -1 < lVar4) {
            local_1f8 = local_98 + chi[1] + -1;
          }
          pDVar9 = (DoubleComplex *)((local_1f8 - local_98) + 1);
          if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
            pnga_nbget(in_stack_fffffffffffffe00,(Integer *)in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0
                       ,(Integer *)in_stack_fffffffffffffdd8);
            pDVar13 = local_100;
            local_100 = pDVar9;
          }
          else {
            pnga_nbget(in_stack_fffffffffffffe00,(Integer *)in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0
                       ,(Integer *)in_stack_fffffffffffffdd8);
            pDVar13 = local_100;
            local_100 = pDVar8;
          }
          if (iVar2 != 0) {
            if ((*in_RSI == 'n') || (*in_RSI == 'N')) {
              pnga_nbget(in_stack_fffffffffffffe00,(Integer *)in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                         in_stack_fffffffffffffde0,(Integer *)in_stack_fffffffffffffdd8);
              local_108 = pDVar8;
            }
            else {
              pnga_nbget(in_stack_fffffffffffffe00,(Integer *)in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                         in_stack_fffffffffffffde0,(Integer *)in_stack_fffffffffffffdd8);
              local_108 = pDVar7;
            }
          }
          if (bVar1) {
            if (in_R8 == 0x3eb) {
              for (local_70 = 0; local_70 < (long)local_118 * (long)cdim_00; local_70 = local_70 + 1
                  ) {
                *(undefined4 *)((long)transb_00 + local_70 * 4) = 0;
              }
            }
            else if (in_R8 == 0x3ec) {
              for (local_70 = 0; local_70 < (long)local_118 * (long)cdim_00; local_70 = local_70 + 1
                  ) {
                transb_00[local_70] = 0;
              }
            }
            else if (in_R8 == 0x3ee) {
              for (local_70 = 0; local_70 < (long)local_118 * (long)cdim_00; local_70 = local_70 + 1
                  ) {
                *(undefined4 *)(transb_00 + local_70) = 0;
                *(undefined4 *)((long)transb_00 + local_70 * 8 + 4) = 0;
              }
            }
            else {
              for (local_70 = 0; local_70 < (long)local_118 * (long)cdim_00; local_70 = local_70 + 1
                  ) {
                transb_00[local_70 * 2] = 0;
                transb_00[local_70 * 2 + 1] = 0;
              }
            }
            pIVar10 = *(Integer **)(a_grp + (long)(int)((int)(short)local_164 ^ 1) * 8);
            pnga_nbwait((Integer *)0x166b65);
            in_stack_fffffffffffffdf0 = transb_00;
            in_stack_fffffffffffffde0 = hi;
            in_stack_fffffffffffffdf8 = adim_00;
            in_stack_fffffffffffffde8 = b_00;
            in_stack_fffffffffffffdd8 = pDVar13;
            if (in_stack_fffffffffffffeb8 != 0) {
              in_stack_fffffffffffffde0 =
                   *(Integer **)(grp_me + (long)(int)((int)(short)local_166 ^ 1) * 8);
              pnga_nbwait((Integer *)0x166bb1);
              in_stack_fffffffffffffdf0 = transb_00;
              in_stack_fffffffffffffdf8 = adim_00;
              in_stack_fffffffffffffde8 = b_00;
              in_stack_fffffffffffffdd8 = pDVar13;
            }
            alpha_00 = in_RDX;
            transb_00 = in_stack_fffffffffffffdf0;
            hi = in_stack_fffffffffffffde0;
            GAI_DGEMM((Integer)pIVar10,(char *)in_stack_fffffffffffffde0,
                      (char *)in_stack_fffffffffffffdf0,CONCAT44(uVar12,uVar11),jdim_00,grp,
                      (void *)in_stack_fffffffffffffeb0,
                      (DoubleComplex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                      ,(Integer)in_stack_fffffffffffffdf8,in_stack_fffffffffffffde8,
                      (Integer)in_stack_fffffffffffffdd8,c_00,(Integer)cdim_00);
            if ((in_R8 == 0x3eb) || (in_R8 == 0x3ee)) {
              pnga_acc((Integer)in_stack_fffffffffffffdf0,(Integer *)in_stack_fffffffffffffde8,
                       in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,pIVar10,alpha_00);
            }
            else {
              pnga_acc((Integer)in_stack_fffffffffffffdf0,(Integer *)in_stack_fffffffffffffde8,
                       in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,pIVar10,alpha_00);
            }
          }
          bVar1 = true;
          local_160 = (int)local_98;
          local_158 = (int)local_1f8;
          local_15c = (int)local_b0;
          local_154 = (int)local_1e8;
          local_164 = local_164 ^ 1;
          if (iVar2 != 0) {
            local_166 = local_166 ^ 1;
          }
          in_stack_fffffffffffffeb8 = iVar2;
          b_00 = local_108;
          c_00 = pDVar8;
          cdim_00 = pDVar7;
          local_118 = pDVar9;
          iVar2 = 0;
        }
        local_e0 = local_e0 + 1;
        adim_00 = pDVar9;
      }
    }
  }
  if (bVar1) {
    if (in_R8 == 0x3eb) {
      for (local_70 = 0; local_70 < (long)local_118 * (long)cdim_00; local_70 = local_70 + 1) {
        *(undefined4 *)((long)transb_00 + local_70 * 4) = 0;
      }
    }
    else if (in_R8 == 0x3ec) {
      for (local_70 = 0; local_70 < (long)local_118 * (long)cdim_00; local_70 = local_70 + 1) {
        transb_00[local_70] = 0;
      }
    }
    else if (in_R8 == 0x3ee) {
      for (local_70 = 0; local_70 < (long)local_118 * (long)cdim_00; local_70 = local_70 + 1) {
        *(undefined4 *)(transb_00 + local_70) = 0;
        *(undefined4 *)((long)transb_00 + local_70 * 8 + 4) = 0;
      }
    }
    else {
      for (local_70 = 0; local_70 < (long)local_118 * (long)cdim_00; local_70 = local_70 + 1) {
        transb_00[local_70 * 2] = 0;
        transb_00[local_70 * 2 + 1] = 0;
      }
    }
    pIVar10 = *(Integer **)(a_grp + (long)(int)((int)(short)local_164 ^ 1) * 8);
    pnga_nbwait((Integer *)0x167130);
    if (in_stack_fffffffffffffeb8 != 0) {
      hi = *(Integer **)(grp_me + (long)(int)((int)(short)local_166 ^ 1) * 8);
      pnga_nbwait((Integer *)0x16717c);
    }
    GAI_DGEMM((Integer)pIVar10,(char *)hi,(char *)transb_00,CONCAT44(uVar12,uVar11),jdim_00,grp,
              (void *)in_stack_fffffffffffffeb0,
              (DoubleComplex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              (Integer)adim_00,b_00,(Integer)local_100,c_00,(Integer)cdim_00);
    if ((in_R8 == 0x3eb) || (in_R8 == 0x3ee)) {
      pnga_acc((Integer)transb_00,(Integer *)b_00,hi,local_100,pIVar10,in_RDX);
    }
    else {
      pnga_acc((Integer)transb_00,(Integer *)b_00,hi,local_100,pIVar10,in_RDX);
    }
  }
  return;
}

Assistant:

static void gai_matmul_irreg(transa, transb, alpha, beta, atype,
			     g_a, ailo, aihi, ajlo, ajhi,
			     g_b, bilo, bihi, bjlo, bjhi,
			     g_c, cilo, cihi, cjlo, cjhi,
			     Ichunk, Kchunk, Jchunk, a_ar,b_ar,c_ar, 
			     need_scaling, irregular) 
     
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     Integer Ichunk, Kchunk, Jchunk, atype;
     void    *alpha, *beta;
     char    *transa, *transb;
     DoubleComplex **a_ar, **b_ar, **c_ar;
     short int need_scaling, irregular;
{

#if DEBUG_
  Integer me= pnga_nodeid();
#endif
  Integer nproc=pnga_nnodes();
  Integer get_new_B, i, i0, i1, j0, j1;
  Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim, ijk=0;
  Integer n, m, k, adim, bdim=0, cdim;
  Integer idim_prev=0, jdim_prev=0, kdim_prev=0;
  Integer adim_prev=0, bdim_prev=0, cdim_prev=0;
  task_list_t taskListC; 
  short int compute_flag=0, shiftA=0, shiftB=0;
  DoubleComplex ONE, *a, *b, *c;
  SingleComplex ONE_CF; 
  Integer grp_me, a_grp = pnga_get_pgroup(g_a);
  Integer clo[2], chi[2];

  init_task_list(&taskListC);
  ONE.real =1.; ONE.imag =0.;
  ONE_CF.real =1.; ONE_CF.imag =0.;
#if DEBUG_
  if(me==0) { printf("@@ga_matmul_irreg:m,n,k=%ld %ld %ld\n", aihi-ailo+1,
      bjhi-bjlo+1,ajhi-ajlo+1); fflush(stdout); }
#endif

  m = aihi - ailo +1;
  n = bjhi - bjlo +1;
  k = ajhi - ajlo +1;
  a = a_ar[0];
  b = b_ar[0];
  c = c_ar[0];

  grp_me = pnga_pgroup_nodeid(a_grp);
  clo[0] = cilo; clo[1] = cjlo;
  chi[0] = cihi; chi[1] = cjhi;
  if(!need_scaling) pnga_fill_patch(g_c, clo, chi, beta);

  compute_flag=0;     /* take care of the last chunk */

  for(jlo = 0; jlo < n; jlo += Jchunk){ /* loop thru columns of g_c patch */
    jhi = GA_MIN(n-1, jlo+Jchunk-1);
    jdim= jhi - jlo +1;

    for(klo = 0; klo < k; klo += Kchunk){    /* loop cols of g_a patch */
      khi = GA_MIN(k-1, klo+Kchunk-1);          /* loop rows of g_b patch */
      kdim= khi - klo +1;                                     

      /** Each pass through the outer two loops means we need a
        different patch of B.*/
      get_new_B = TRUE;

      for(ilo = 0; ilo < m; ilo+=Ichunk){ /* loop thru rows of g_c patch */

        if(ijk%nproc == grp_me){

          ihi = GA_MIN(m-1, ilo+Ichunk-1);
          idim= cdim = ihi - ilo +1;


          if (*transa == 'n' || *transa == 'N'){ 
            adim = idim;
            i0= ailo+ilo; i1= ailo+ihi;   
            j0= ajlo+klo; j1= ajlo+khi;
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            pnga_nbget(g_a, clo, chi, a_ar[shiftA], 
                &idim, &gNbhdlA[shiftA]);
          }else{
            adim = kdim;
            i0= ajlo+klo; i1= ajlo+khi;   
            j0= ailo+ilo; j1= ailo+ihi;
            clo[0] = i0;
            clo[1] = j0;
            chi[0] = i1;
            chi[1] = j1;
            pnga_nbget(g_a, clo, chi, a_ar[shiftA],
                &kdim, &gNbhdlA[shiftA]);
          }

          /* Avoid rereading B if it is same patch as last time. */
          if(get_new_B) { 
            if (*transb == 'n' || *transb == 'N'){ 
              bdim = kdim;
              i0= bilo+klo; i1= bilo+khi;
              j0= bjlo+jlo; j1= bjlo+jhi;
              clo[0] = i0;
              clo[1] = j0;
              chi[0] = i1;
              chi[1] = j1;
              pnga_nbget(g_b, clo, chi, b_ar[shiftB], 
                  &kdim, &gNbhdlB[shiftB]);
            }else{
              bdim = jdim;
              i0= bjlo+jlo; i1= bjlo+jhi;   
              j0= bilo+klo; j1= bilo+khi;
              clo[0] = i0;
              clo[1] = j0;
              chi[0] = i1;
              chi[1] = j1;
              pnga_nbget(g_b, clo, chi, b_ar[shiftB], 
                  &jdim, &gNbhdlB[shiftB]);
            }
          }

          if(compute_flag) { /* compute loop */

            if(atype == C_FLOAT) 
              for(i=0;i<idim_prev*jdim_prev;i++) *(((float*)c)+i)=0;
            else if(atype ==  C_DBL)
              for(i=0;i<idim_prev*jdim_prev;i++) *(((double*)c)+i)=0;
            else if(atype ==  C_SCPL)
              for(i=0;i<idim_prev*jdim_prev;i++) {
                ((SingleComplex*)c)[i].real=0;
                ((SingleComplex*)c)[i].imag=0;
              }
            else for(i=0;i<idim_prev*jdim_prev;i++) {
              c[i].real=0;c[i].imag=0; }

            /* wait till we get the previous block */
            a = a_ar[shiftA^1];
            WAIT_GET_BLOCK(&gNbhdlA[shiftA^1]);
            if(taskListC.chunkBId) {
              b = b_ar[shiftB^1];
              WAIT_GET_BLOCK(&gNbhdlB[shiftB^1]);
            }

            /* Do the sequential matrix multiply - i.e.BLAS dgemm */
            GAI_DGEMM(atype, transa, transb, idim_prev, jdim_prev, 
                kdim_prev, alpha, a, adim_prev, b, bdim_prev, 
                c, cdim_prev);

            i0= cilo + taskListC.lo[0];
            i1= cilo + taskListC.hi[0];
            j0= cjlo + taskListC.lo[1];
            j1= cjlo + taskListC.hi[1];

            if(atype == C_FLOAT || atype == C_SCPL) {
              clo[0] = i0;
              clo[1] = j0;
              chi[0] = i1;
              chi[1] = j1;
              pnga_acc(g_c, clo, chi, (float *)c, &cdim_prev, &ONE_CF);
            } else {
              clo[0] = i0;
              clo[1] = j0;
              chi[0] = i1;
              chi[1] = j1;
              pnga_acc(g_c, clo, chi, (DoublePrecision*)c, &cdim_prev, (DoublePrecision*)&ONE);
            }
          }
          compute_flag=1;

          /* meta-data of current block for next compute loop */
          taskListC.lo[0] = ilo; taskListC.hi[0] = ihi;
          taskListC.lo[1] = jlo; taskListC.hi[1] = jhi;
          taskListC.chunkBId = get_new_B;
          idim_prev = idim;   adim_prev = adim;
          jdim_prev = jdim;   bdim_prev = bdim;
          kdim_prev = kdim;   cdim_prev = cdim;

          /* shift bext buffer */
          shiftA ^= 1;
          if(get_new_B) shiftB ^= 1;

          get_new_B = FALSE; /* Until J or K change again */
        }
        ++ijk;
      }
    }
  }

  /* -------- compute the last chunk --------- */
  if(compute_flag) {
    if(atype == C_FLOAT) 
      for(i=0;i<idim_prev*jdim_prev;i++) *(((float*)c)+i)=0;
    else if(atype ==  C_DBL)
      for(i=0;i<idim_prev*jdim_prev;i++) *(((double*)c)+i)=0;
    else if(atype ==  C_SCPL)
      for(i=0;i<idim_prev*jdim_prev;i++) {
        ((SingleComplex*)c)[i].real=0;
        ((SingleComplex*)c)[i].imag=0;
      }
    else for(i=0;i<idim_prev*jdim_prev;i++) {
      c[i].real=0;c[i].imag=0; }

    /* wait till we get the previous block */
    a = a_ar[shiftA^1];
    WAIT_GET_BLOCK(&gNbhdlA[shiftA^1]);
    if(taskListC.chunkBId) {
      b = b_ar[shiftB^1];
      WAIT_GET_BLOCK(&gNbhdlB[shiftB^1]);
    }

    /* Do the sequential matrix multiply - i.e.BLAS dgemm */
    GAI_DGEMM(atype, transa, transb, idim_prev, jdim_prev, 
        kdim_prev, alpha, a, adim_prev, b, bdim_prev, 
        c, cdim_prev);

    i0= cilo + taskListC.lo[0];
    i1= cilo + taskListC.hi[0];
    j0= cjlo + taskListC.lo[1];
    j1= cjlo + taskListC.hi[1];

    if(atype == C_FLOAT || atype == C_SCPL) {
      clo[0] = i0;
      clo[1] = j0;
      chi[0] = i1;
      chi[1] = j1;
      pnga_acc(g_c, clo, chi, (float *)c, &cdim_prev, &ONE_CF);
    } else {
      clo[0] = i0;
      clo[1] = j0;
      chi[0] = i1;
      chi[1] = j1;
      pnga_acc(g_c, clo, chi, (DoublePrecision*)c, &cdim_prev, (DoublePrecision*)&ONE);
    }
  }
  /* ----------------------------------------- */
}